

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesr.cc
# Opt level: O0

void __thiscall
GOESRImageHandler::handleImageForFalseColor(GOESRImageHandler *this,GOESRProduct *p1)

{
  bool bVar1;
  __type_conflict _Var2;
  Region *pRVar3;
  mapped_type *this_00;
  Handler *config;
  reference pvVar4;
  runtime_error *this_01;
  element_type *this_02;
  GOESRProduct *this_03;
  GOESRProduct *in_RSI;
  GOESRImageHandler *in_RDI;
  timespec tVar5;
  string path;
  Mat mat;
  unique_ptr<Image,_std::default_delete<Image>_> out;
  unique_ptr<Image,_std::default_delete<Image>_> i1;
  unique_ptr<Image,_std::default_delete<Image>_> i0;
  size_type pos;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  FilenameBuilder fb;
  type p0;
  string key;
  Timer t;
  GOESRProduct *in_stack_fffffffffffff908;
  FilenameBuilder *in_stack_fffffffffffff910;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff918;
  string *this_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff930;
  string *this_05;
  Handler *config_00;
  string *in_stack_fffffffffffff9b0;
  string local_628 [32];
  string local_608 [32];
  Mat local_5e8 [96];
  GOESRProduct *in_stack_fffffffffffffa78;
  GOESRProduct *in_stack_fffffffffffffa80;
  FilenameBuilder *in_stack_fffffffffffffa88;
  int *in_stack_fffffffffffffaa0;
  char (*in_stack_fffffffffffffaa8) [2];
  char (*in_stack_fffffffffffffab0) [100];
  char (*in_stack_fffffffffffffab8) [48];
  char in_stack_fffffffffffffac7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffac8;
  char in_stack_fffffffffffffae7;
  string *in_stack_fffffffffffffae8;
  string local_510 [32];
  string local_4f0 [32];
  string local_4d0 [35];
  undefined1 local_4ad;
  undefined4 local_4ac;
  string local_4a8 [32];
  long local_488;
  string local_480 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_460 [2];
  Mat *in_stack_fffffffffffffbd8;
  unique_ptr<Image,_std::default_delete<Image>_> *in_stack_fffffffffffffbe0;
  unique_ptr<Image,_std::default_delete<Image>_> *in_stack_fffffffffffffbe8;
  string local_238 [32];
  string local_218 [32];
  timespec local_1f8;
  Handler *local_1e8;
  __syscall_slong_t local_1e0;
  GOESRProduct local_1d8;
  undefined4 local_5c;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>,_true>
  local_58 [3];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>,_true>
  local_40;
  string local_38 [32];
  undefined1 local_18 [24];
  
  Timer::Timer((Timer *)in_stack_fffffffffffff910);
  pRVar3 = GOESRProduct::getRegion(in_RSI);
  std::__cxx11::string::string(local_38,(string *)pRVar3);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>_>
               *)in_stack_fffffffffffff908,(key_type *)0x29ec6d);
  local_58[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>_>
              *)in_stack_fffffffffffff908);
  bVar1 = std::__detail::operator==(&local_40,local_58);
  if (bVar1) {
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>_>
    ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>_>
                  *)in_stack_fffffffffffff910,(key_type *)in_stack_fffffffffffff908);
    GOESRProduct::operator=((GOESRProduct *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
    local_5c = 1;
  }
  else {
    this_00 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>_>
              ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>_>
                            *)in_stack_fffffffffffff910,(key_type *)in_stack_fffffffffffff908);
    GOESRProduct::GOESRProduct((GOESRProduct *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>_>
    ::erase((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>_>
             *)in_stack_fffffffffffff910,(key_type *)in_stack_fffffffffffff908);
    tVar5 = GOESRProduct::getFrameStart(&local_1d8);
    local_1e0 = tVar5.tv_nsec;
    config = (Handler *)tVar5.tv_sec;
    config_00 = config;
    local_1e8 = config;
    local_1f8 = GOESRProduct::getFrameStart(in_RSI);
    this_03 = (GOESRProduct *)local_1f8.tv_nsec;
    if (config == (Handler *)local_1f8.tv_sec) {
      GOESRProduct::getChannel(&local_1d8);
      GOESRProduct::getChannel(in_RSI);
      _Var2 = std::operator==(in_stack_fffffffffffff930,in_stack_fffffffffffff928);
      if (_Var2) {
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>_>
        ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>_>
                      *)in_stack_fffffffffffff910,(key_type *)in_stack_fffffffffffff908);
        GOESRProduct::operator=((GOESRProduct *)in_stack_fffffffffffff910,in_stack_fffffffffffff908)
        ;
        local_5c = 1;
      }
      else {
        GOESRProduct::getChannel(&local_1d8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff910);
        bVar1 = std::operator!=(&in_stack_fffffffffffff910->dir,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff908);
        if (bVar1) {
          std::swap<GOESRProduct>(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
        }
        GOESRProduct::getFilenameBuilder(this_03,config);
        std::__cxx11::string::string(local_480,(string *)&stack0xfffffffffffffbd8);
        util::split(in_stack_fffffffffffffae8,in_stack_fffffffffffffae7);
        std::__cxx11::string::~string(local_480);
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](local_460,1);
        local_488 = std::__cxx11::string::rfind((char)pvVar4,0x43);
        if (local_488 == -1) {
          local_4ad = 1;
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_4ac = 0x22e;
          util::str<char[48],char[100],char[2],int>
                    (in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,
                     in_stack_fffffffffffffaa0);
          std::runtime_error::runtime_error(this_01,local_4a8);
          local_4ad = 0;
          __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](local_460,1);
        std::__cxx11::string::substr((ulong)local_4f0,(ulong)pvVar4);
        std::operator+(in_stack_fffffffffffff918,(char *)in_stack_fffffffffffff910);
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](local_460,1);
        std::__cxx11::string::operator=((string *)pvVar4,local_4d0);
        std::__cxx11::string::~string(local_4d0);
        std::__cxx11::string::~string(local_4f0);
        util::join(in_stack_fffffffffffffac8,in_stack_fffffffffffffac7);
        this_05 = local_510;
        std::__cxx11::string::operator=((string *)&stack0xfffffffffffffbd8,this_05);
        std::__cxx11::string::~string(this_05);
        std::__cxx11::string::operator=(local_238,"FC");
        std::__cxx11::string::operator=(local_218,"False Color");
        GOESRProduct::getImage(this_00,config_00);
        GOESRProduct::getImage(this_00,config_00);
        cv::Mat::Mat((Mat *)&stack0xfffffffffffffa78,&(in_RDI->config_).lut);
        Image::generateFalseColor
                  (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
        cv::Mat::~Mat((Mat *)&stack0xfffffffffffffa78);
        std::unique_ptr<Image,_std::default_delete<Image>_>::reset
                  ((unique_ptr<Image,_std::default_delete<Image>_> *)in_stack_fffffffffffff910,
                   (pointer)in_stack_fffffffffffff908);
        std::unique_ptr<Image,_std::default_delete<Image>_>::reset
                  ((unique_ptr<Image,_std::default_delete<Image>_> *)in_stack_fffffffffffff910,
                   (pointer)in_stack_fffffffffffff908);
        std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                  ((unique_ptr<Image,_std::default_delete<Image>_> *)0x29f2d3);
        Image::getRawImage((Image *)in_stack_fffffffffffff908);
        overlayMaps(in_RDI,&local_1d8,local_5e8);
        this_04 = &(in_RDI->config_).filename;
        std::__cxx11::string::string(local_628,(string *)&(in_RDI->config_).format);
        FilenameBuilder::build
                  (in_stack_fffffffffffffa88,(string *)in_stack_fffffffffffffa80,
                   (string *)in_stack_fffffffffffffa78);
        std::__cxx11::string::~string(local_628);
        this_02 = std::__shared_ptr_access<FileWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<FileWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x29f375);
        FileWriter::write(this_02,(int)local_608,local_5e8,(size_t)local_18);
        if (((in_RDI->config_).json & 1U) != 0) {
          in_stack_fffffffffffff910 =
               (FilenameBuilder *)
               std::__shared_ptr_access<FileWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<FileWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x29f3c0);
          GOESRProduct::firstFile((GOESRProduct *)0x29f3d2);
          FileWriter::writeHeader((FileWriter *)in_RDI,(File *)in_RSI,in_stack_fffffffffffff9b0);
        }
        std::__cxx11::string::~string(local_608);
        cv::Mat::~Mat(local_5e8);
        std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr
                  ((unique_ptr<Image,_std::default_delete<Image>_> *)this_04);
        std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr
                  ((unique_ptr<Image,_std::default_delete<Image>_> *)this_04);
        std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr
                  ((unique_ptr<Image,_std::default_delete<Image>_> *)this_04);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_04);
        FilenameBuilder::~FilenameBuilder(in_stack_fffffffffffff910);
        local_5c = 0;
      }
    }
    else {
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>_>
      ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>_>
                    *)in_stack_fffffffffffff910,(key_type *)in_stack_fffffffffffff908);
      GOESRProduct::operator=((GOESRProduct *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      local_5c = 1;
    }
    GOESRProduct::~GOESRProduct((GOESRProduct *)in_stack_fffffffffffff910);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void GOESRImageHandler::handleImageForFalseColor(GOESRProduct p1) {
  Timer t;

  const auto key = p1.getRegion().nameShort;
  if (falseColor_.find(key) == falseColor_.end()) {
    falseColor_[key] = std::move(p1);
    return;
  }

  // Move existing product into local scope such that the local
  // one is the only remaining reference to this product.
  auto p0 = std::move(falseColor_[key]);
  falseColor_.erase(key);

  // Verify that observation time is identical.
  if (p0.getFrameStart().tv_sec != p1.getFrameStart().tv_sec) {
    falseColor_[key] = std::move(p1);
    return;
  }

  // If the channels are the same, there has been duplication on the
  // packet stream and we can ignore the latest one.
  if (p0.getChannel().nameShort == p1.getChannel().nameShort) {
    falseColor_[key] = std::move(p0);
    return;
  }

  // Swap if ordering of products doesn't match ordering of channels
  if (p0.getChannel().nameShort != config_.channels.front()) {
    std::swap(p0, p1);
  }

  // Use filename builder of first channel
  auto fb = p0.getFilenameBuilder(config_);

  // Update filename in filename builder to reflect that this is a
  // synthesized image. It would be misleading to use the filename of
  // either one of the input files.
  //
  // For example: in OR_ABI-L2-CMIPF-M3C13_G16_[...] the C13 is
  // replaced by CFC.
  //
  auto parts = split(fb.filename, '_');
  auto pos = parts[1].rfind('C');
  ASSERT(pos != std::string::npos);
  parts[1] = parts[1].substr(0, pos) + "CFC";
  fb.filename = join(parts, '_');

  // Replace channel field in filename builder.
  // The incoming filename builder will have the channel set to one of
  // the two channels used for this false color image.
  fb.channel.nameShort = "FC";
  fb.channel.nameLong = "False Color";

  // Generate false color image.
  auto i0 = p0.getImage(config_);
  auto i1 = p1.getImage(config_);
  auto out = Image::generateFalseColor(i0, i1, config_.lut);
  i0.reset();
  i1.reset();

  auto mat = out->getRawImage();
  overlayMaps(p0, mat);
  auto path = fb.build(config_.filename, config_.format);
  fileWriter_->write(path, mat, &t);
  if (config_.json) {
    fileWriter_->writeHeader(p0.firstFile(), path);
  }
}